

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O2

string * __thiscall
duckdb::FMTFormat::
OP<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
          (string *__return_storage_ptr__,FMTFormat *this,char *format_str,
          vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_true>
          *format_args)

{
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  in_R8;
  basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  FMTFormat *local_10;
  
  args.field_1.values_ = in_R8.values_;
  args.types_ = *(unsigned_long_long *)format_str;
  local_10 = this;
  duckdb_fmt::v6::vformat<char_const*,char>
            (__return_storage_ptr__,(v6 *)&local_10,
             (char **)(*(long *)(format_str + 8) - *(unsigned_long_long *)format_str >> 5 &
                       0xffffffff | 0x8000000000000000),args);
  return __return_storage_ptr__;
}

Assistant:

static string OP(const char *format_str, vector<duckdb_fmt::basic_format_arg<CTX>> &format_args) {
		return duckdb_fmt::vformat(
		    format_str, duckdb_fmt::basic_format_args<CTX>(format_args.data(), static_cast<int>(format_args.size())));
	}